

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O2

int filter_lookup(filter **filt,kqueue *kq,short id)

{
  int iVar1;
  int *piVar2;
  
  if ((ushort)id < 0xfff4) {
    iVar1 = 0x16;
  }
  else {
    *filt = kq->kq_filt + (~(uint)(ushort)id & 0xffff);
    if (kq->kq_filt[~(uint)(ushort)id & 0xffff].kf_copyout !=
        (_func_int_kevent_ptr_int_filter_ptr_knote_ptr_void_ptr *)0x0) {
      return 0;
    }
    iVar1 = 0x26;
  }
  piVar2 = __errno_location();
  *piVar2 = iVar1;
  *filt = (filter *)0x0;
  return -1;
}

Assistant:

int
filter_lookup(struct filter **filt, struct kqueue *kq, short id)
{
    if (~id < 0 || ~id >= EVFILT_SYSCOUNT) {
        dbg_printf("filt=%d inv_filt=%d - invalid id", id, (~id));
        errno = EINVAL;
        *filt = NULL;
        return (-1);
    }
    *filt = &kq->kq_filt[~id];
    if ((*filt)->kf_copyout == NULL) {
        dbg_printf("filt=%d - filt_name=%s not implemented", id, filter_name(id));
        errno = ENOSYS;
        *filt = NULL;
        return (-1);
    }

    return (0);
}